

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O2

void Imf_3_2::saveFlatTiledImage(string *fileName,Header *hdr,FlatImage *img,DataWindowSource dws)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  LevelMode LVar6;
  int iVar7;
  int iVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  undefined4 *puVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined4 extraout_var;
  const_iterator cVar14;
  ConstIterator CVar15;
  string *psVar16;
  int y;
  int x;
  TiledOutputFile out;
  undefined4 uStack_94;
  LevelMode local_90;
  LevelRoundingMode LStack_8c;
  Header newHdr;
  
  _out = 0;
  Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,&newHdr,0x40,0x40,&out,0,3);
  p_Var9 = (_Rb_tree_node_base *)Imf_3_2::Header::begin();
  while( true ) {
    p_Var10 = (_Rb_tree_node_base *)Imf_3_2::Header::end();
    if (p_Var9 == p_Var10) break;
    p_Var10 = p_Var9 + 1;
    iVar5 = strcmp((char *)p_Var10,"dataWindow");
    if (iVar5 != 0) {
      iVar5 = strcmp((char *)p_Var10,"tiles");
      if (iVar5 != 0) {
        iVar5 = strcmp((char *)p_Var10,"channels");
        if (iVar5 != 0) {
          Imf_3_2::Header::insert((char *)&newHdr,(Attribute *)p_Var10);
        }
      }
    }
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
  }
  cVar4 = Imf_3_2::Header::hasTileDescription();
  if (cVar4 == '\0') {
    local_90 = Image::levelMode(&img->super_Image);
    LStack_8c = Image::levelRoundingMode(&img->super_Image);
    _out = 0x4000000040;
    Imf_3_2::Header::setTileDescription((TileDescription *)&newHdr);
  }
  else {
    puVar11 = (undefined4 *)Imf_3_2::Header::tileDescription();
    uVar1 = *puVar11;
    lVar12 = Imf_3_2::Header::tileDescription();
    uVar2 = *(undefined4 *)(lVar12 + 4);
    local_90 = Image::levelMode(&img->super_Image);
    LStack_8c = Image::levelRoundingMode(&img->super_Image);
    _out = CONCAT44(uVar2,uVar1);
    Imf_3_2::Header::setTileDescription((TileDescription *)&newHdr);
  }
  dataWindowForFile((Imf_3_2 *)&out,hdr,&img->super_Image,dws);
  puVar13 = (undefined8 *)Imf_3_2::Header::dataWindow();
  *puVar13 = _out;
  puVar13[1] = CONCAT44(LStack_8c,local_90);
  iVar5 = (*(img->super_Image)._vptr_Image[6])(img,0,0);
  cVar14._M_node = (_Base_ptr)FlatImageLevel::begin((FlatImageLevel *)CONCAT44(extraout_var,iVar5));
  while( true ) {
    CVar15 = FlatImageLevel::end((FlatImageLevel *)CONCAT44(extraout_var,iVar5));
    if ((const_iterator)cVar14._M_node == CVar15._i._M_node) break;
    psVar16 = (string *)Imf_3_2::Header::channels();
    _out = ImageChannel::channel(*(ImageChannel **)(cVar14._M_node + 2));
    Imf_3_2::ChannelList::insert(psVar16,(Channel *)(cVar14._M_node + 1));
    cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
  }
  pcVar3 = (fileName->_M_dataplus)._M_p;
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledOutputFile::TiledOutputFile(&out,pcVar3,&newHdr,iVar5);
  LVar6 = Image::levelMode(&img->super_Image);
  if (LVar6 == ONE_LEVEL) {
    anon_unknown_21::saveLevel(&out,img,0,0);
  }
  else if (LVar6 == MIPMAP_LEVELS) {
    iVar5 = 0;
    while( true ) {
      iVar7 = Imf_3_2::TiledOutputFile::numLevels();
      if (iVar7 <= iVar5) break;
      anon_unknown_21::saveLevel(&out,img,iVar5,iVar5);
      iVar5 = iVar5 + 1;
    }
  }
  else if (LVar6 == RIPMAP_LEVELS) {
    iVar5 = 0;
    while( true ) {
      iVar7 = Imf_3_2::TiledOutputFile::numYLevels();
      if (iVar7 <= iVar5) break;
      iVar7 = 0;
      while( true ) {
        iVar8 = Imf_3_2::TiledOutputFile::numXLevels();
        if (iVar8 <= iVar7) break;
        anon_unknown_21::saveLevel(&out,img,iVar7,iVar5);
        iVar7 = iVar7 + 1;
      }
      iVar5 = iVar5 + 1;
    }
  }
  Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
  Imf_3_2::Header::~Header(&newHdr);
  return;
}

Assistant:

void
saveFlatTiledImage (
    const string&    fileName,
    const Header&    hdr,
    const FlatImage& img,
    DataWindowSource dws)
{
    Header newHdr;

    for (Header::ConstIterator i = hdr.begin (); i != hdr.end (); ++i)
    {
        if (strcmp (i.name (), "dataWindow") && strcmp (i.name (), "tiles") &&
            strcmp (i.name (), "channels"))
        {
            newHdr.insert (i.name (), i.attribute ());
        }
    }

    if (hdr.hasTileDescription ())
    {
        newHdr.setTileDescription (TileDescription (
            hdr.tileDescription ().xSize,
            hdr.tileDescription ().ySize,
            img.levelMode (),
            img.levelRoundingMode ()));
    }
    else
    {
        newHdr.setTileDescription (TileDescription (
            64, // xSize
            64, // ySize
            img.levelMode (),
            img.levelRoundingMode ()));
    }

    newHdr.dataWindow () = dataWindowForFile (hdr, img, dws);

    const FlatImageLevel& level = img.level (0, 0);

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        newHdr.channels ().insert (i.name (), i.channel ().channel ());

    TiledOutputFile out (fileName.c_str (), newHdr);

    switch (img.levelMode ())
    {
        case ONE_LEVEL: saveLevel (out, img, 0, 0); break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < out.numLevels (); ++x)
                saveLevel (out, img, x, x);

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < out.numYLevels (); ++y)
                for (int x = 0; x < out.numXLevels (); ++x)
                    saveLevel (out, img, x, y);

            break;

        default: assert (false);
    }
}